

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::Ranged_For_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::eval_internal
          (Ranged_For_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *t_ss)

{
  Type_Conversions *pTVar1;
  bool bVar2;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *psVar3;
  Boxed_Value BVar4;
  Boxed_Value range_obj;
  anon_class_8_1_8991db09 get_function;
  Boxed_Value range_expression_result;
  Scope_Push_Pop spp;
  anon_class_8_1_8991db09 call_function;
  type pop_front_funcs;
  type front_funcs;
  type empty_funcs;
  type range_funcs;
  anon_class_24_3_0ad2d99a do_loop;
  atomic<unsigned_long> local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110 [3];
  undefined1 local_f8 [8];
  undefined1 local_f0 [16];
  Boxed_Value local_e0;
  undefined1 local_d0 [8];
  Boxed_Value local_c8;
  Boxed_Value local_b8;
  Boxed_Value local_a8;
  Ranged_For_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *local_98;
  string *local_90;
  Boxed_Value local_88;
  undefined1 local_78 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_40 [16];
  
  pTVar1 = t_ss[2].m_conversions.m_conversions._M_data;
  psVar3 = (string *)((pTVar1->m_mutex)._M_impl._M_rwlock.__align + 0x10);
  AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)local_f0,
             *(Dispatch_State **)((long)&(pTVar1->m_mutex)._M_impl._M_rwlock + 8));
  local_90 = psVar3;
  local_78._0_8_ = psVar3;
  local_78._16_8_ = t_ss;
  bVar2 = Type_Info::bare_equal_type_info
                    ((Type_Info *)local_f0._0_8_,
                     (type_info *)
                     &std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
                      typeinfo);
  if (bVar2) {
    boxed_cast<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&>
              ((Boxed_Value *)local_f0,(Type_Conversions_State *)0x0);
    const::{lambda(auto:1_const&)#1}::operator()
              ((_lambda_auto_1_const___1_ *)this,
               (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_78
              );
  }
  else {
    bVar2 = Type_Info::bare_equal_type_info
                      ((Type_Info *)local_f0._0_8_,
                       (type_info *)
                       &std::
                        map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
                        ::typeinfo);
    if (bVar2) {
      boxed_cast<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>const&>
                ((Boxed_Value *)local_f0,(Type_Conversions_State *)0x0);
      const::{lambda(auto:1_const&)#1}::operator()
                ((_lambda_auto_1_const___1_ *)this,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
                  *)local_78);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"range",(allocator<char> *)&local_a8);
      const::{lambda(std::__cxx11::string_const&,auto:1&)#1}::operator()
                (&local_88,(string *)local_f8,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"empty",(allocator<char> *)&local_b8);
      const::{lambda(std::__cxx11::string_const&,auto:1&)#1}::operator()
                (&local_a8,(string *)local_f8,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"front",(allocator<char> *)&local_c8);
      const::{lambda(std::__cxx11::string_const&,auto:1&)#1}::operator()
                (&local_b8,(string *)local_f8,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"pop_front",(allocator<char> *)&local_e0);
      const::{lambda(std::__cxx11::string_const&,auto:1&)#1}::operator()
                (&local_c8,(string *)local_f8,&local_118);
      local_98 = this;
      std::__cxx11::string::~string((string *)&local_118);
      const::{lambda(auto:1_const&,chaiscript::Boxed_Value_const&)#1}::operator()
                (&local_118,
                 (shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                  *)local_d0,&local_88);
      while( true ) {
        const::{lambda(auto:1_const&,chaiscript::Boxed_Value_const&)#1}::operator()
                  (&local_e0,
                   (shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                    *)local_d0,&local_a8);
        bVar2 = boxed_cast<bool>(&local_e0,(Type_Conversions_State *)0x0);
        Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_e0.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (bVar2) break;
        chaiscript::detail::Dispatch_Engine::new_scope((in_RDX->m_stack_holder)._M_data);
        const::{lambda(auto:1_const&,chaiscript::Boxed_Value_const&)#1}::operator()
                  ((Boxed_Value *)(local_78 + 0x18),
                   (shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                    *)local_d0,&local_b8);
        chaiscript::detail::Dispatch_State::add_get_object
                  (in_RDX,local_90,(Boxed_Value *)(local_78 + 0x18));
        Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
        AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
                  ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)local_40,
                   *(Dispatch_State **)
                    ((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                            _M_rwlock + 0x10));
        Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
        const::{lambda(auto:1_const&,chaiscript::Boxed_Value_const&)#1}::operator()
                  (local_50,(shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                             *)local_d0,&local_c8);
        Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
        detail::Scope_Push_Pop::~Scope_Push_Pop((Scope_Push_Pop *)&local_e0);
      }
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_110);
      this = local_98;
      void_var();
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_c8.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_b8.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_a8.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_88.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        const auto get_function = [&t_ss](const std::string &t_name, auto &t_hint) {
          uint_fast32_t hint = t_hint;
          auto [funs_loc, funs] = t_ss->get_function(t_name, hint);
          if (funs_loc != hint) {
            t_hint = uint_fast32_t(funs_loc);
          }
          return std::move(funs);
        };

        const auto call_function = [&t_ss](const auto &t_funcs, const Boxed_Value &t_param) {
          return dispatch::dispatch(*t_funcs, Function_Params{t_param}, t_ss.conversions());
        };

        const std::string &loop_var_name = this->children[0]->text;
        Boxed_Value range_expression_result = this->children[1]->eval(t_ss);

        const auto do_loop = [&loop_var_name, &t_ss, this](const auto &ranged_thing) {
          try {
            for (auto &&loop_var : ranged_thing) {
              // This scope push and pop might not be the best thing for perf
              // but we know it's 100% correct
              chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);
              /// to-do make this if-constexpr with C++17 branch
              if (!std::is_same<std::decay_t<decltype(loop_var)>, Boxed_Value>::value) {
                t_ss.add_get_object(loop_var_name, Boxed_Value(std::ref(loop_var)));
              } else {
                t_ss.add_get_object(loop_var_name, Boxed_Value(loop_var));
              }
              try {
                this->children[2]->eval(t_ss);
              } catch (detail::Continue_Loop &) {
              }
            }
          } catch (detail::Break_Loop &) {
            // loop broken
          }
          return void_var();
        };

        if (range_expression_result.get_type_info().bare_equal_type_info(typeid(std::vector<Boxed_Value>))) {
          return do_loop(boxed_cast<const std::vector<Boxed_Value> &>(range_expression_result));
        } else if (range_expression_result.get_type_info().bare_equal_type_info(typeid(std::map<std::string, Boxed_Value>))) {
          return do_loop(boxed_cast<const std::map<std::string, Boxed_Value> &>(range_expression_result));
        } else {
          const auto range_funcs = get_function("range", m_range_loc);
          const auto empty_funcs = get_function("empty", m_empty_loc);
          const auto front_funcs = get_function("front", m_front_loc);
          const auto pop_front_funcs = get_function("pop_front", m_pop_front_loc);

          try {
            const auto range_obj = call_function(range_funcs, range_expression_result);
            while (!boxed_cast<bool>(call_function(empty_funcs, range_obj))) {
              chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);
              t_ss.add_get_object(loop_var_name, call_function(front_funcs, range_obj));
              try {
                this->children[2]->eval(t_ss);
              } catch (detail::Continue_Loop &) {
                // continue statement hit
              }
              call_function(pop_front_funcs, range_obj);
            }
          } catch (detail::Break_Loop &) {
            // loop broken
          }
          return void_var();
        }
      }